

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<signed_char,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,list_entry_t *target
               ,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  char *v_t;
  _func_int **pp_Var1;
  data_t dVar2;
  Vector *pVVar3;
  idx_t iVar4;
  reference q_00;
  unsigned_long *q;
  _func_int **pp_Var5;
  uint64_t uVar6;
  FunctionData *pFVar7;
  idx_t n;
  QuantileDirect<signed_char> local_89;
  FunctionData *local_88;
  data_ptr_t local_80;
  list_entry_t *local_78;
  AggregateFinalizeData *local_70;
  Vector *local_68;
  vector<duckdb::QuantileValue,_true> *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar7 = (this->bind_data).ptr;
    pVVar3 = ListVector::GetEntry(finalize_data->result);
    iVar4 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar7[2]._vptr_FunctionData - (long)pFVar7[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar4);
    local_80 = pVVar3->data;
    v_t = (state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    target->offset = iVar4;
    pp_Var5 = pFVar7[4]._vptr_FunctionData;
    pp_Var1 = pFVar7[5]._vptr_FunctionData;
    if (pp_Var5 != pp_Var1) {
      local_60 = (vector<duckdb::QuantileValue,_true> *)(pFVar7 + 1);
      local_80 = local_80 + iVar4;
      iVar4 = 0;
      local_88 = pFVar7;
      local_78 = target;
      local_70 = finalize_data;
      local_68 = pVVar3;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_60,(size_type)*pp_Var5);
        n = (long)(state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_58.desc = *(bool *)&local_88[7]._vptr_FunctionData;
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar4;
        local_58.end = n;
        dVar2 = Interpolator<true>::
                Operation<signed_char,signed_char,duckdb::QuantileDirect<signed_char>>
                          (&local_58,v_t,local_68,&local_89);
        local_80[(long)*pp_Var5] = dVar2;
        pp_Var5 = pp_Var5 + 1;
        iVar4 = local_58.FRN;
      } while (pp_Var5 != pp_Var1);
      iVar4 = local_78->offset;
      target = local_78;
      finalize_data = local_70;
      pFVar7 = local_88;
    }
    uVar6 = ((long)pFVar7[2]._vptr_FunctionData - (long)pFVar7[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    target->length = uVar6;
    ListVector::SetListSize(finalize_data->result,uVar6 + iVar4);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}